

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestHierarchyUtil.cpp
# Opt level: O1

void tcu::writeTxtCaselistsToFiles(TestPackageRoot *root,TestContext *testCtx,CommandLine *cmdLine)

{
  char cVar1;
  State SVar2;
  TestNode *pTVar3;
  string *psVar4;
  ostream *poVar5;
  Exception *this;
  char *pcVar6;
  bool bVar7;
  string filename;
  MovePtr<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_> caseListFilter;
  DefaultHierarchyInflater inflater;
  TestHierarchyIterator iter;
  ofstream out;
  allocator<char> local_312;
  allocator<char> local_311;
  string local_310;
  string local_2f0;
  string local_2d0;
  undefined8 local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2a8;
  char *local_2a0;
  UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_> local_298;
  DefaultHierarchyInflater local_288;
  TestHierarchyIterator local_278;
  undefined1 local_230 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  int aiStack_210 [54];
  ios_base local_138 [264];
  
  DefaultHierarchyInflater::DefaultHierarchyInflater(&local_288,testCtx);
  CommandLine::createCaseListFilter
            ((MovePtr<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> *)local_230,
             testCtx->m_cmdLine,testCtx->m_curArchive);
  local_298.m_data.ptr = (CaseListFilter *)local_230._0_8_;
  local_230._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  de::details::UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>::reset
            ((UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> *)local_230)
  ;
  TestHierarchyIterator::TestHierarchyIterator
            (&local_278,root,&local_288.super_TestHierarchyInflater,local_298.m_data.ptr);
  local_2a0 = CommandLine::getCaseListExportFile(cmdLine);
  local_2a8 = _VTT;
  local_2b0 = _operator_delete__;
  while( true ) {
    SVar2 = TestHierarchyIterator::getState(&local_278);
    if (SVar2 == STATE_FINISHED) {
      TestHierarchyIterator::~TestHierarchyIterator(&local_278);
      de::details::
      UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>::reset
                (&local_298);
      DefaultHierarchyInflater::~DefaultHierarchyInflater(&local_288);
      return;
    }
    pTVar3 = TestHierarchyIterator::getNode(&local_278);
    pcVar6 = (pTVar3->m_name)._M_dataplus._M_p;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_230,local_2a0,&local_311);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,pcVar6,&local_312);
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"txt","");
    makePackageFilename(&local_2f0,(string *)local_230,&local_310,&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._0_8_ != &local_220) {
      operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
    }
    std::ofstream::ofstream((string *)local_230,local_2f0._M_dataplus._M_p,_S_bin);
    cVar1 = std::__basic_file<char>::is_open();
    if ((cVar1 == '\0') || (*(int *)((long)aiStack_210 + *(long *)(local_230._0_8_ + -0x18)) != 0))
    break;
    print("Writing test cases from \'%s\' to file \'%s\'..\n",pcVar6,local_2f0._M_dataplus._M_p);
    TestHierarchyIterator::next(&local_278);
    while( true ) {
      pTVar3 = TestHierarchyIterator::getNode(&local_278);
      if (pTVar3->m_nodeType == NODETYPE_PACKAGE) break;
      SVar2 = TestHierarchyIterator::getState(&local_278);
      if (SVar2 == STATE_ENTER_NODE) {
        pTVar3 = TestHierarchyIterator::getNode(&local_278);
        bVar7 = pTVar3->m_nodeType - NODETYPE_SELF_VALIDATE < 4;
        pcVar6 = "GROUP";
        if (bVar7) {
          pcVar6 = "TEST";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_230,pcVar6,5 - (ulong)bVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,": ",2);
        psVar4 = TestHierarchyIterator::getNodePath_abi_cxx11_(&local_278);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_230,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      }
      TestHierarchyIterator::next(&local_278);
    }
    TestHierarchyIterator::next(&local_278);
    local_230._0_8_ = local_2a8;
    *(undefined8 *)(local_230 + *(long *)((long)local_2a8 + -0x18)) = local_2b0;
    std::filebuf::~filebuf((filebuf *)(local_230 + 8));
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
  }
  this = (Exception *)__cxa_allocate_exception(0x30);
  std::operator+(&local_310,"Failed to open ",&local_2f0);
  Exception::Exception(this,&local_310);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void writeTxtCaselistsToFiles (TestPackageRoot& root, TestContext& testCtx, const CommandLine& cmdLine)
{
	DefaultHierarchyInflater			inflater		(testCtx);
	de::MovePtr<const CaseListFilter>	caseListFilter	(testCtx.getCommandLine().createCaseListFilter(testCtx.getArchive()));

	TestHierarchyIterator				iter			(root, inflater, *caseListFilter);
	const char* const					filenamePattern = cmdLine.getCaseListExportFile();

	while (iter.getState() != TestHierarchyIterator::STATE_FINISHED)
	{
		const TestNode* node		= iter.getNode();
		const char*		pkgName		= node->getName();
		const string	filename	= makePackageFilename(filenamePattern, pkgName, "txt");

		DE_ASSERT(iter.getState() == TestHierarchyIterator::STATE_ENTER_NODE &&
				  node->getNodeType() == NODETYPE_PACKAGE);

		std::ofstream out(filename.c_str(), std::ios_base::binary);
		if (!out.is_open() || !out.good())
			throw Exception("Failed to open " + filename);

		print("Writing test cases from '%s' to file '%s'..\n", pkgName, filename.c_str());

		iter.next();

		while (iter.getNode()->getNodeType() != NODETYPE_PACKAGE)
		{
			if (iter.getState() == TestHierarchyIterator::STATE_ENTER_NODE)
				out << (isTestNodeTypeExecutable(iter.getNode()->getNodeType()) ? "TEST" : "GROUP") << ": " << iter.getNodePath() << "\n";
			iter.next();
		}

		DE_ASSERT(iter.getState() == TestHierarchyIterator::STATE_LEAVE_NODE &&
				  iter.getNode()->getNodeType() == NODETYPE_PACKAGE);
		iter.next();
	}
}